

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

int __thiscall Fl_Input_::undo(Fl_Input_ *this)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int n;
  int *piVar4;
  uint uVar5;
  int iVar6;
  uint uVar8;
  wchar_t local_3c;
  size_t local_38;
  ulong uVar7;
  
  n = undoinsert;
  iVar3 = undocut;
  was_up_down = 0;
  iVar6 = 0;
  if (undowidget == this) {
    iVar6 = 0;
    if (undocut != 0 || undoinsert != 0) {
      uVar5 = undoat - undoinsert;
      uVar7 = (ulong)uVar5;
      put_in_buffer(this,this->size_ + undocut);
      uVar8 = uVar5;
      if (iVar3 != 0) {
        memmove(this->buffer + (int)uVar5 + iVar3,this->buffer + (int)uVar5,
                (long)(int)((this->size_ - uVar5) + 1));
        memcpy(this->buffer + (int)uVar5,undobuffer,(long)iVar3);
        this->size_ = this->size_ + iVar3;
        uVar8 = uVar5 + iVar3;
      }
      if (n == 0) {
        piVar4 = &undocut;
      }
      else {
        local_38 = (size_t)n;
        undobuffersize(n);
        memcpy(undobuffer,this->buffer + (int)uVar8,local_38);
        memmove(this->buffer + (int)uVar8,this->buffer + (int)uVar8 + local_38,
                (long)(int)((this->size_ - (n + uVar8)) + 1));
        this->size_ = this->size_ - n;
        undocut = n;
        piVar4 = &yankcut;
      }
      *piVar4 = n;
      undoinsert = iVar3;
      undoat = uVar8;
      this->mark_ = uVar8;
      this->position_ = uVar8;
      if ((0 < (int)uVar5 & (this->super_Fl_Widget).type_ >> 4) == 1) {
        uVar7 = (ulong)uVar5;
        do {
          local_3c = L'\0';
          uVar8 = fl_utf8decode(this->value_ + uVar7,this->value_ + this->size_,&local_3c);
          if (uVar8 == 10) goto LAB_001bc736;
          bVar2 = 1 < (long)uVar7;
          uVar7 = uVar7 - 1;
        } while (bVar2);
        uVar7 = 0;
      }
LAB_001bc736:
      minimal_update(this,(int)uVar7);
      puVar1 = &(this->super_Fl_Widget).flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      iVar6 = 1;
      if (((this->super_Fl_Widget).when_ & 1) != 0) {
        Fl_Widget::do_callback
                  (&this->super_Fl_Widget,&this->super_Fl_Widget,(this->super_Fl_Widget).user_data_)
        ;
      }
    }
  }
  return iVar6;
}

Assistant:

int Fl_Input_::undo() {
  was_up_down = 0;
  if ( undowidget != this || (!undocut && !undoinsert) ) return 0;

  int ilen = undocut;
  int xlen = undoinsert;
  int b = undoat-xlen;
  int b1 = b;

  put_in_buffer(size_+ilen);

  if (ilen) {
    memmove(buffer+b+ilen, buffer+b, size_-b+1);
    memcpy(buffer+b, undobuffer, ilen);
    size_ += ilen;
    b += ilen;
  }

  if (xlen) {
    undobuffersize(xlen);
    memcpy(undobuffer, buffer+b, xlen);
    memmove(buffer+b, buffer+b+xlen, size_-xlen-b+1);
    size_ -= xlen;
  }

  undocut = xlen;
  if (xlen) yankcut = xlen;
  undoinsert = ilen;
  undoat = b;
  mark_ = b /* -ilen */;
  position_ = b;

  if (wrap())
    while (b1 > 0 && index(b1)!='\n') b1--;
  minimal_update(b1);
  set_changed();
  if (when()&FL_WHEN_CHANGED) do_callback();
  return 1;
}